

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

void __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::~hamt_map(hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
            *this)

{
  ~hamt_map(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~hamt_map () override { this->clear (); }